

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O3

void google::protobuf::anon_unknown_26::ToDuration(uint128 *value,bool negative,Duration *duration)

{
  int iVar1;
  uint64 uVar2;
  int iVar3;
  uint64 uVar4;
  uint128 *puVar5;
  undefined7 in_register_00000031;
  uint128 local_58;
  uint128 local_48;
  int local_34;
  
  local_34 = (int)CONCAT71(in_register_00000031,negative);
  local_58.lo_ = 1000000000;
  local_58.hi_ = 0;
  local_48.lo_ = value->lo_;
  local_48.hi_ = value->hi_;
  puVar5 = uint128::operator/=(&local_48,&local_58);
  uVar2 = puVar5->lo_;
  local_58.lo_ = 1000000000;
  local_58.hi_ = 0;
  local_48.lo_ = value->lo_;
  local_48.hi_ = value->hi_;
  puVar5 = uint128::operator%=(&local_48,&local_58);
  iVar1 = (int)puVar5->lo_;
  iVar3 = -iVar1;
  uVar4 = -uVar2;
  if (local_34 == 0) {
    iVar3 = iVar1;
    uVar4 = uVar2;
  }
  duration->seconds_ = uVar4;
  duration->nanos_ = iVar3;
  return;
}

Assistant:

void ToDuration(const uint128& value, bool negative, Duration* duration) {
  int64 seconds =
      static_cast<int64>(Uint128Low64(value / kNanosPerSecond));
  int32 nanos = static_cast<int32>(Uint128Low64(value % kNanosPerSecond));
  if (negative) {
    seconds = -seconds;
    nanos = -nanos;
  }
  duration->set_seconds(seconds);
  duration->set_nanos(nanos);
}